

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O1

void __thiscall chrono::ChTimestepperHeun::Advance(ChTimestepperHeun *this,double dt)

{
  ChState *pCVar1;
  ChVectorDynamic<> *pCVar2;
  ChStateDelta *pCVar3;
  double *pdVar4;
  double *pdVar5;
  ChIntegrable *pCVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ChState *pCVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  Index size;
  Index index;
  ulong uVar22;
  ulong uVar23;
  ActualDstType actualDst_1;
  long lVar24;
  ActualDstType actualDst;
  ActualDstType actualDst_2;
  ChState result_1;
  ChState result;
  ChStateDelta local_c0;
  undefined1 local_a8 [24];
  double *local_90;
  Index IStack_88;
  ChVectorDynamic<> *local_78;
  ChState *local_70;
  ChStateDelta *local_68;
  ChStateDelta local_60;
  ChStateDelta local_48;
  
  local_70 = &(this->super_ChTimestepperIorder).Y;
  local_68 = &(this->super_ChTimestepperIorder).dYdt;
  (*((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable[3])();
  iVar19 = (**((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable
           )();
  iVar20 = (*((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable
             [1])();
  iVar21 = (*((this->super_ChTimestepperIorder).super_ChTimestepper.integrable)->_vptr_ChIntegrable
             [2])();
  pCVar1 = &this->y_new;
  ChState::setZero(pCVar1,(long)iVar19,
                   (this->super_ChTimestepperIorder).super_ChTimestepper.integrable);
  pCVar3 = &this->Dydt1;
  ChStateDelta::setZero
            (pCVar3,(long)iVar20,(this->super_ChTimestepperIorder).super_ChTimestepper.integrable);
  ChStateDelta::setZero
            (&this->Dydt2,(long)iVar20,
             (this->super_ChTimestepperIorder).super_ChTimestepper.integrable);
  pCVar2 = &(this->super_ChTimestepperIorder).super_ChTimestepper.L;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar21);
  lVar24 = (this->super_ChTimestepperIorder).super_ChTimestepper.L.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (lVar24 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar24 != 0) {
    memset((pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar24 << 3);
  }
  pCVar18 = local_70;
  pCVar6 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  (*pCVar6->_vptr_ChIntegrable[4])
            (pCVar6,local_70,&(this->super_ChTimestepperIorder).super_ChTimestepper.T);
  pCVar6 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
  local_78 = pCVar2;
  (*pCVar6->_vptr_ChIntegrable[10])
            ((this->super_ChTimestepperIorder).super_ChTimestepper.T,dt,pCVar6,pCVar3,pCVar2,pCVar18
             ,0,0);
  ChStateDelta::operator*(&local_c0,pCVar3,dt);
  ChState::ChState((ChState *)local_a8,
                   (this->super_ChTimestepperIorder).Y.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
                   (this->super_ChTimestepperIorder).Y.integrable);
  pCVar6 = (this->super_ChTimestepperIorder).Y.integrable;
  (*pCVar6->_vptr_ChIntegrable[0xb])(pCVar6,local_a8,pCVar18,&local_c0);
  uVar17 = local_a8._8_8_;
  uVar16 = local_a8._0_8_;
  if ((this->y_new).super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_a8._8_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar1,local_a8._8_8_,1);
  }
  uVar23 = (this->y_new).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (uVar23 == uVar17) {
    pdVar7 = (pCVar1->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar22 = uVar23 + 7;
    if (-1 < (long)uVar23) {
      uVar22 = uVar23;
    }
    uVar22 = uVar22 & 0xfffffffffffffff8;
    if (7 < (long)uVar23) {
      lVar24 = 0;
      do {
        pdVar8 = (double *)(uVar16 + lVar24 * 8);
        dVar9 = pdVar8[1];
        dVar10 = pdVar8[2];
        dVar11 = pdVar8[3];
        dVar12 = pdVar8[4];
        dVar13 = pdVar8[5];
        dVar14 = pdVar8[6];
        dVar15 = pdVar8[7];
        pdVar4 = pdVar7 + lVar24;
        *pdVar4 = *pdVar8;
        pdVar4[1] = dVar9;
        pdVar4[2] = dVar10;
        pdVar4[3] = dVar11;
        pdVar4[4] = dVar12;
        pdVar4[5] = dVar13;
        pdVar4[6] = dVar14;
        pdVar4[7] = dVar15;
        lVar24 = lVar24 + 8;
      } while (lVar24 < (long)uVar22);
    }
    if ((long)uVar22 < (long)uVar23) {
      do {
        pdVar7[uVar22] = *(double *)(uVar16 + uVar22 * 8);
        uVar22 = uVar22 + 1;
      } while (uVar23 != uVar22);
    }
    (this->y_new).integrable = (ChIntegrable *)local_a8._16_8_;
    if ((double *)local_a8._0_8_ != (double *)0x0) {
      free(*(void **)(local_a8._0_8_ + -8));
    }
    pCVar2 = local_78;
    if (local_c0.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_c0.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [-1]);
    }
    pCVar6 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
    (*pCVar6->_vptr_ChIntegrable[10])(pCVar6,&this->Dydt2,pCVar2,pCVar1,1,1);
    local_90 = (double *)0x0;
    IStack_88 = 0;
    local_a8._0_8_ =
         (this->Dydt2).super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_a8._8_8_ =
         (this->Dydt2).super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)local_a8._8_8_ < 0 && (double *)local_a8._0_8_ != (double *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                   );
    }
    ChStateDelta::operator+(&local_60,pCVar3,(ChVectorConstRef)local_a8);
    pCVar3 = local_68;
    pCVar1 = local_70;
    ChStateDelta::operator*(&local_48,&local_60,dt * 0.5);
    ChState::ChState((ChState *)&local_c0,
                     (this->super_ChTimestepperIorder).Y.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                     ,(this->super_ChTimestepperIorder).Y.integrable);
    pCVar6 = (this->super_ChTimestepperIorder).Y.integrable;
    (*pCVar6->_vptr_ChIntegrable[0xb])(pCVar6,&local_c0,pCVar1,&local_48);
    pdVar7 = local_c0.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if ((this->super_ChTimestepperIorder).Y.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        local_c0.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar1,
                 local_c0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1);
    }
    uVar23 = (this->super_ChTimestepperIorder).Y.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (uVar23 == local_c0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar8 = (pCVar1->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar22 = uVar23 + 7;
      if (-1 < (long)uVar23) {
        uVar22 = uVar23;
      }
      uVar22 = uVar22 & 0xfffffffffffffff8;
      if (7 < (long)uVar23) {
        lVar24 = 0;
        do {
          pdVar4 = pdVar7 + lVar24;
          dVar9 = pdVar4[1];
          dVar10 = pdVar4[2];
          dVar11 = pdVar4[3];
          dVar12 = pdVar4[4];
          dVar13 = pdVar4[5];
          dVar14 = pdVar4[6];
          dVar15 = pdVar4[7];
          pdVar5 = pdVar8 + lVar24;
          *pdVar5 = *pdVar4;
          pdVar5[1] = dVar9;
          pdVar5[2] = dVar10;
          pdVar5[3] = dVar11;
          pdVar5[4] = dVar12;
          pdVar5[5] = dVar13;
          pdVar5[6] = dVar14;
          pdVar5[7] = dVar15;
          lVar24 = lVar24 + 8;
        } while (lVar24 < (long)uVar22);
      }
      if ((long)uVar22 < (long)uVar23) {
        do {
          pdVar8[uVar22] = pdVar7[uVar22];
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
      (this->super_ChTimestepperIorder).Y.integrable = local_c0.integrable;
      if (local_c0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_c0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_48.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_48.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_60.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_60.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_90 != (double *)0x0) {
        free((void *)local_90[-1]);
      }
      pdVar7 = (this->Dydt2).super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar23 = (this->Dydt2).super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((this->super_ChTimestepperIorder).dYdt.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar23)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar3,uVar23,1);
      }
      uVar22 = (this->super_ChTimestepperIorder).dYdt.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (uVar22 == uVar23) {
        pdVar8 = (pCVar3->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar23 = uVar22 + 7;
        if (-1 < (long)uVar22) {
          uVar23 = uVar22;
        }
        uVar23 = uVar23 & 0xfffffffffffffff8;
        if (7 < (long)uVar22) {
          lVar24 = 0;
          do {
            pdVar4 = pdVar7 + lVar24;
            dVar9 = pdVar4[1];
            dVar10 = pdVar4[2];
            dVar11 = pdVar4[3];
            dVar12 = pdVar4[4];
            dVar13 = pdVar4[5];
            dVar14 = pdVar4[6];
            dVar15 = pdVar4[7];
            pdVar5 = pdVar8 + lVar24;
            *pdVar5 = *pdVar4;
            pdVar5[1] = dVar9;
            pdVar5[2] = dVar10;
            pdVar5[3] = dVar11;
            pdVar5[4] = dVar12;
            pdVar5[5] = dVar13;
            pdVar5[6] = dVar14;
            pdVar5[7] = dVar15;
            lVar24 = lVar24 + 8;
          } while (lVar24 < (long)uVar23);
        }
        if ((long)uVar23 < (long)uVar22) {
          do {
            pdVar8[uVar23] = pdVar7[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar22 != uVar23);
        }
        pCVar6 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
        (this->super_ChTimestepperIorder).dYdt.integrable = (this->Dydt2).integrable;
        (this->super_ChTimestepperIorder).super_ChTimestepper.T =
             dt + (this->super_ChTimestepperIorder).super_ChTimestepper.T;
        (*pCVar6->_vptr_ChIntegrable[5])(pCVar6,pCVar1,1);
        pCVar6 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
        (*pCVar6->_vptr_ChIntegrable[7])(pCVar6,pCVar3);
        pCVar6 = (this->super_ChTimestepperIorder).super_ChTimestepper.integrable;
        (*pCVar6->_vptr_ChIntegrable[9])(pCVar6,local_78);
        return;
      }
    }
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

void ChTimestepperHeun::Advance(const double dt) {
    // setup main vectors
    GetIntegrable()->StateSetup(Y, dYdt);

    // setup auxiliary vectors
    int n_y = GetIntegrable()->GetNcoords_y();
    int n_dy = GetIntegrable()->GetNcoords_dy();
    int n_c = GetIntegrable()->GetNconstr();
    y_new.setZero(n_y, GetIntegrable());
    Dydt1.setZero(n_dy, GetIntegrable());
    Dydt2.setZero(n_dy, GetIntegrable());
    L.setZero(n_c);

    GetIntegrable()->StateGather(Y, T);  // state <- system

    GetIntegrable()->StateSolve(Dydt1, L, Y, T, dt,
                                false,  // no need to scatter state before computation
                                false   // full update? ( not used, since no scatter)
    );
    y_new = Y + Dydt1 * dt;
    GetIntegrable()->StateSolve(Dydt2, L, y_new, T + dt, dt, true, true);

    Y = Y + (Dydt1 + Dydt2) * (dt / 2.);
    dYdt = Dydt2;
    T += dt;

    GetIntegrable()->StateScatter(Y, T, true);            // state -> system
    GetIntegrable()->StateScatterDerivative(dYdt);  // -> system auxiliary data
    GetIntegrable()->StateScatterReactions(L);      // -> system auxiliary data
}